

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O1

void __thiscall sf::Shape::update(Shape *this)

{
  VertexArray *this_00;
  float fVar1;
  float fVar2;
  Vector2f VVar3;
  Color CVar4;
  int iVar5;
  undefined4 extraout_var;
  Vertex *pVVar7;
  Vertex *pVVar8;
  size_t index;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  FloatRect FVar9;
  ulong uVar6;
  
  iVar5 = (*(this->super_Drawable)._vptr_Drawable[3])();
  uVar6 = CONCAT44(extraout_var,iVar5);
  this_00 = &this->m_vertices;
  if (uVar6 < 3) {
    VertexArray::resize(this_00,0);
    VertexArray::resize(&this->m_outlineVertices,0);
    return;
  }
  VertexArray::resize(this_00,uVar6 + 2);
  index = 0;
  do {
    (*(this->super_Drawable)._vptr_Drawable[4])(this,index);
    index = index + 1;
    pVVar7 = VertexArray::operator[](this_00,index);
    VVar3.y = extraout_XMM0_Db;
    VVar3.x = extraout_XMM0_Da;
    pVVar7->position = VVar3;
  } while (uVar6 != index);
  pVVar7 = VertexArray::operator[](this_00,1);
  pVVar8 = VertexArray::operator[](this_00,uVar6 + 1);
  pVVar8->position = pVVar7->position;
  pVVar7 = VertexArray::operator[](this_00,1);
  pVVar8 = VertexArray::operator[](this_00,0);
  CVar4 = pVVar7->color;
  fVar1 = (pVVar7->texCoords).x;
  pVVar8->position = pVVar7->position;
  pVVar8->color = CVar4;
  (pVVar8->texCoords).x = fVar1;
  (pVVar8->texCoords).y = (pVVar7->texCoords).y;
  FVar9 = VertexArray::getBounds(this_00);
  this->m_insideBounds = FVar9;
  fVar1 = (this->m_insideBounds).width;
  fVar2 = (this->m_insideBounds).left;
  pVVar7 = VertexArray::operator[](this_00,0);
  (pVVar7->position).x = fVar1 * 0.5 + fVar2;
  fVar1 = (this->m_insideBounds).height;
  fVar2 = (this->m_insideBounds).top;
  pVVar7 = VertexArray::operator[](this_00,0);
  (pVVar7->position).y = fVar1 * 0.5 + fVar2;
  updateFillColors(this);
  updateTexCoords(this);
  updateOutline(this);
  return;
}

Assistant:

void Shape::update()
{
    // Get the total number of points of the shape
    std::size_t count = getPointCount();
    if (count < 3)
    {
        m_vertices.resize(0);
        m_outlineVertices.resize(0);
        return;
    }

    m_vertices.resize(count + 2); // + 2 for center and repeated first point

    // Position
    for (std::size_t i = 0; i < count; ++i)
        m_vertices[i + 1].position = getPoint(i);
    m_vertices[count + 1].position = m_vertices[1].position;

    // Update the bounding rectangle
    m_vertices[0] = m_vertices[1]; // so that the result of getBounds() is correct
    m_insideBounds = m_vertices.getBounds();

    // Compute the center and make it the first vertex
    m_vertices[0].position.x = m_insideBounds.left + m_insideBounds.width / 2;
    m_vertices[0].position.y = m_insideBounds.top + m_insideBounds.height / 2;

    // Color
    updateFillColors();

    // Texture coordinates
    updateTexCoords();

    // Outline
    updateOutline();
}